

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::PixelPackBufferStorageTestCase::initTestCaseGlobal(PixelPackBufferStorageTestCase *this)

{
  GLuint GVar1;
  GLenum GVar2;
  int *piVar3;
  TestError *this_00;
  NotSupportedError *this_01;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  string local_50;
  char *gradient_vs_code;
  char *gradient_fs_code;
  
  gradient_fs_code =
       "#version 330 core\n\nout vec4 result;\n\nvoid main()\n{\n    float c = 1.0 - (gl_FragCoord.y - 0.5) / 1023.0;\n    result  = vec4(c);\n}\n"
  ;
  gradient_vs_code =
       "#version 330\n\nvoid main()\n{\n    switch (gl_VertexID)\n    {\n        case 0: gl_Position = vec4(-1.0, -1.0, 0.0, 1.0); break;\n        case 1: gl_Position = vec4( 1.0, -1.0, 0.0, 1.0); break;\n        case 2: gl_Position = vec4(-1.0,  1.0, 0.0, 1.0); break;\n        case 3: gl_Position = vec4( 1.0,  1.0, 0.0, 1.0); break;\n    }\n}\n"
  ;
  GVar1 = SparseBufferTestUtilities::createProgram
                    (this->m_gl,&gradient_fs_code,1,&gradient_vs_code,1,(char **)0x0,(uint *)0x0,0,
                     (GLchar **)0x0,0,0);
  this->m_po = GVar1;
  if (GVar1 == 0) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Failed to link the test program",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
               ,0xccf);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*this->m_gl->genVertexArrays)(1,&this->m_vao);
  GVar2 = (*this->m_gl->getError)();
  glu::checkError(GVar2,"glGenVertexArrays() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0xcd4);
  (*this->m_gl->bindVertexArray)(this->m_vao);
  GVar2 = (*this->m_gl->getError)();
  glu::checkError(GVar2,"glBindVertexArray() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0xcd7);
  (*this->m_gl->genFramebuffers)(1,&this->m_fbo);
  GVar2 = (*this->m_gl->getError)();
  glu::checkError(GVar2,"glGenFramebuffers() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0xcdb);
  (*this->m_gl->bindFramebuffer)(0x8d40,this->m_fbo);
  GVar2 = (*this->m_gl->getError)();
  glu::checkError(GVar2,"glBindFramebuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0xcde);
  (*this->m_gl->readBuffer)(0x8ce0);
  GVar2 = (*this->m_gl->getError)();
  glu::checkError(GVar2,"glReadBuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0xce1);
  (*this->m_gl->genRenderbuffers)(1,&this->m_color_rb);
  GVar2 = (*this->m_gl->getError)();
  glu::checkError(GVar2,"glGenRenderbuffers() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0xce5);
  (*this->m_gl->bindRenderbuffer)(0x8d41,this->m_color_rb);
  GVar2 = (*this->m_gl->getError)();
  glu::checkError(GVar2,"glBindRenderbuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0xce8);
  (*this->m_gl->renderbufferStorage)(0x8d41,0x8058,this->m_color_rb_width,this->m_color_rb_height);
  GVar2 = (*this->m_gl->getError)();
  glu::checkError(GVar2,"glRenderbufferStorage() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0xceb);
  (*this->m_gl->framebufferRenderbuffer)(0x8d40,0x8ce0,0x8d41,this->m_color_rb);
  GVar2 = (*this->m_gl->getError)();
  glu::checkError(GVar2,"glFramebufferRenderbuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0xcee);
  GVar2 = (*this->m_gl->checkFramebufferStatus)(0x8d40);
  if (GVar2 == 0x8cd5) {
    uVar7 = 0;
    (*this->m_gl->viewport)(0,0,this->m_color_rb_width,this->m_color_rb_height);
    GVar2 = (*this->m_gl->getError)();
    glu::checkError(GVar2,"glViewport() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0xcf9);
    uVar4 = this->m_page_size;
    uVar6 = this->m_ref_data_size;
    this->m_sparse_bo_size = uVar6;
    this->m_sparse_bo_size_rounded = (uVar4 - uVar6 % uVar4) % uVar4 + uVar6;
    piVar3 = (int *)operator_new__((ulong)uVar6);
    this->m_ref_data_ptr = (uchar *)piVar3;
    uVar4 = this->m_color_rb_height;
    if (uVar4 != 0) {
      uVar6 = this->m_color_rb_width;
      do {
        if (uVar6 == 0) {
          uVar6 = 0;
        }
        else {
          uVar5 = 0;
          do {
            *piVar3 = ((int)((1.0 - (float)uVar7 / (float)(uVar4 - 1)) * 255.0) & 0xffU) * 0x1010101
            ;
            piVar3 = piVar3 + 1;
            uVar5 = uVar5 + 1;
            uVar6 = this->m_color_rb_width;
          } while (uVar5 < uVar6);
          uVar4 = this->m_color_rb_height;
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 < uVar4);
    }
    (*this->m_gl->genBuffers)(1,&this->m_helper_bo);
    GVar2 = (*this->m_gl->getError)();
    glu::checkError(GVar2,"glGenBuffers() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0xd13);
    (*this->m_gl->bindBuffer)(0x8f36,this->m_helper_bo);
    GVar2 = (*this->m_gl->getError)();
    glu::checkError(GVar2,"glBindBuffer() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0xd16);
    (*this->m_gl->bufferStorage)(0x8f36,(ulong)this->m_ref_data_size,this->m_ref_data_ptr,1);
    GVar2 = (*this->m_gl->getError)();
    glu::checkError(GVar2,"glBufferStorage() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0xd19);
    return true;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,
             "Cannot execute the test - driver does not support renderingto a GL_RGBA8 renderbuffer-based color attachment"
             ,"");
  tcu::NotSupportedError::NotSupportedError(this_01,&local_50);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

bool PixelPackBufferStorageTestCase::initTestCaseGlobal()
{
	/* Determine dummy vertex shader and fragment shader that will generate black-to-white gradient. */
	const char* gradient_fs_code = "#version 330 core\n"
								   "\n"
								   "out vec4 result;\n"
								   "\n"
								   "void main()\n"
								   "{\n"
								   "    float c = 1.0 - (gl_FragCoord.y - 0.5) / 1023.0;\n"
								   "    result  = vec4(c);\n"
								   "}\n";

	const char* gradient_vs_code = "#version 330\n"
								   "\n"
								   "void main()\n"
								   "{\n"
								   "    switch (gl_VertexID)\n"
								   "    {\n"
								   "        case 0: gl_Position = vec4(-1.0, -1.0, 0.0, 1.0); break;\n"
								   "        case 1: gl_Position = vec4( 1.0, -1.0, 0.0, 1.0); break;\n"
								   "        case 2: gl_Position = vec4(-1.0,  1.0, 0.0, 1.0); break;\n"
								   "        case 3: gl_Position = vec4( 1.0,  1.0, 0.0, 1.0); break;\n"
								   "    }\n"
								   "}\n";

	m_po = SparseBufferTestUtilities::createProgram(m_gl, &gradient_fs_code, 1, /* n_fs_body_parts */
													&gradient_vs_code, 1,		/* n_vs_body_parts*/
													NULL,						/* attribute_names */
													NULL,						/* attribute_locations */
													GL_NONE,					/* attribute_properties */
													0,							/* tf_varyings */
													0,							/* n_tf_varyings */
													0);							/* tf_varying_mode */
	if (m_po == 0)
	{
		TCU_FAIL("Failed to link the test program");
	}

	/* Generate and bind VAO */
	m_gl.genVertexArrays(1, &m_vao);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGenVertexArrays() call failed.");

	m_gl.bindVertexArray(m_vao);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindVertexArray() call failed.");

	/* Generate and bind FBO */
	m_gl.genFramebuffers(1, &m_fbo);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGenFramebuffers() call failed.");

	m_gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindFramebuffer() call failed.");

	m_gl.readBuffer(GL_COLOR_ATTACHMENT0);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glReadBuffer() call failed.");

	/* Generate and bind RBO and attach it to FBO as a color attachment */
	m_gl.genRenderbuffers(1, &m_color_rb);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGenRenderbuffers() call failed.");

	m_gl.bindRenderbuffer(GL_RENDERBUFFER, m_color_rb);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindRenderbuffer() call failed.");

	m_gl.renderbufferStorage(GL_RENDERBUFFER, GL_RGBA8, m_color_rb_width, m_color_rb_height);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glRenderbufferStorage() call failed.");

	m_gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, m_color_rb);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glFramebufferRenderbuffer() call failed.");

	if (m_gl.checkFramebufferStatus(GL_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE)
	{
		throw tcu::NotSupportedError("Cannot execute the test - driver does not support rendering"
									 "to a GL_RGBA8 renderbuffer-based color attachment");
	}

	m_gl.viewport(0, /* x */
				  0, /* y */
				  m_color_rb_width, m_color_rb_height);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glViewport() call failed.");

	/* Determine what sparse buffer storage size we are going to need*/
	m_sparse_bo_size		 = m_ref_data_size;
	m_sparse_bo_size_rounded = SparseBufferTestUtilities::alignOffset(m_sparse_bo_size, m_page_size);

	/* Prepare the texture data */
	unsigned char* ref_data_traveller_ptr = DE_NULL;

	m_ref_data_ptr		   = new unsigned char[m_ref_data_size];
	ref_data_traveller_ptr = m_ref_data_ptr;

	for (unsigned int y = 0; y < m_color_rb_height; ++y)
	{
		const unsigned char color = (unsigned char)((1.0f - float(y) / float(m_color_rb_height - 1)) * 255.0f);

		for (unsigned int x = 0; x < m_color_rb_width; ++x)
		{
			memset(ref_data_traveller_ptr, color, 4); /* rgba */

			ref_data_traveller_ptr += 4; /* rgba */
		}								 /* for (all columns) */
	}									 /* for (all rows) */

	/* Set up the helper buffer object. */
	m_gl.genBuffers(1, &m_helper_bo);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGenBuffers() call failed.");

	m_gl.bindBuffer(GL_COPY_READ_BUFFER, m_helper_bo);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBuffer() call failed.");

	m_gl.bufferStorage(GL_COPY_READ_BUFFER, m_ref_data_size, m_ref_data_ptr, GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferStorage() call failed.");

	return true;
}